

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O1

int Js::LocalsWalker::GetAdjustedByteCodeOffset(DiagStackFrame *frame)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  
  iVar2 = (*frame->_vptr_DiagStackFrame[3])();
  bVar1 = DiagStackFrame::IsTopFrame(frame);
  if (!bVar1) {
    uVar3 = (*frame->_vptr_DiagStackFrame[0xc])(frame);
    iVar2 = iVar2 - (uVar3 & 0xff);
  }
  return iVar2;
}

Assistant:

int LocalsWalker::GetAdjustedByteCodeOffset(DiagStackFrame* frame)
    {
        int offset = frame->GetByteCodeOffset();
        if (!frame->IsTopFrame() && frame->IsInterpreterFrame())
        {
            // Native frames are already adjusted so just need to adjust interpreted
            // frames that are not the top frame.
            --offset;
        }

        return offset;
    }